

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_defs.h
# Opt level: O3

DVector3 * __thiscall
AActor::PosRelative(DVector3 *__return_storage_ptr__,AActor *this,line_t *line)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = (this->__Pos).Y;
  dVar1 = (this->__Pos).Z;
  iVar2 = this->Sector->PortalGroup;
  iVar3 = line->frontsector->PortalGroup;
  dVar5 = 0.0;
  dVar6 = 0.0;
  if (iVar2 != iVar3) {
    dVar5 = Displacements.data.Array[iVar3 * Displacements.size + iVar2].pos.X;
    dVar6 = Displacements.data.Array[iVar3 * Displacements.size + iVar2].pos.Y;
  }
  __return_storage_ptr__->X = (this->__Pos).X + dVar5;
  __return_storage_ptr__->Y = dVar4 + dVar6;
  __return_storage_ptr__->Z = dVar1;
  return __return_storage_ptr__;
}

Assistant:

inline DVector3 AActor::PosRelative(line_t *line) const
{
	return Pos() + Displacements.getOffset(Sector->PortalGroup, line->frontsector->PortalGroup);
}